

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

void Nwk_ObjDeleteFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pNVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = pObj->nFanins;
  uVar5 = pObj->nFanouts + iVar1;
  uVar7 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  iVar8 = 0;
  bVar4 = false;
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    pNVar3 = pObj->pFanio[uVar7];
    if ((bVar4) || (pNVar3 != pFanin)) {
      lVar9 = (long)iVar8;
      iVar8 = iVar8 + 1;
      pObj->pFanio[lVar9] = pNVar3;
    }
    else {
      bVar4 = true;
    }
  }
  if ((int)uVar6 == iVar8 + 1) {
    pObj->nFanins = iVar1 + -1;
    iVar8 = pFanin->nFanins;
    iVar2 = pFanin->nFanouts;
    iVar1 = iVar2 + iVar8;
    bVar4 = false;
    for (lVar9 = (long)iVar8; lVar9 < iVar1; lVar9 = lVar9 + 1) {
      pNVar3 = pFanin->pFanio[lVar9];
      if ((bVar4) || (pNVar3 != pObj)) {
        lVar10 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pFanin->pFanio[lVar10] = pNVar3;
      }
      else {
        bVar4 = true;
      }
    }
    if ((int)lVar9 == iVar8 + 1) {
      pFanin->nFanouts = iVar2 + -1;
      return;
    }
    __assert_fail("i == k + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                  ,0xd5,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  __assert_fail("i == k + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkFanio.c"
                ,0xcb,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjDeleteFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{
    int i, k, Limit, fFound;
    // remove pFanin from the fanin list of pObj
    Limit = pObj->nFanins + pObj->nFanouts;
    fFound = 0;
    for ( k = i = 0; i < Limit; i++ )
        if ( fFound || pObj->pFanio[i] != pFanin )
            pObj->pFanio[k++] = pObj->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanin
    pObj->nFanins--;
    // remove pObj from the fanout list of pFanin
    Limit = pFanin->nFanins + pFanin->nFanouts;
    fFound = 0;
    for ( k = i = pFanin->nFanins; i < Limit; i++ )
        if ( fFound || pFanin->pFanio[i] != pObj )
            pFanin->pFanio[k++] = pFanin->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanout
    pFanin->nFanouts--; 
}